

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  int *varToPopulate;
  long lVar4;
  undefined8 uStack_250;
  int aiStack_248 [2];
  allocator<char> local_240 [8];
  ostringstream promptStream;
  string local_c8 [8];
  string prompt_1;
  string local_88 [8];
  string prompt;
  uint local_34 [2];
  int size;
  
  uStack_250 = 0x1023a3;
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Please enter an array size: ",local_240);
  uStack_250 = 0x1023af;
  std::__cxx11::string::string((string *)(prompt.field_2._M_local_buf + 8),local_88);
  uStack_250 = 0x1023bc;
  getInt((int *)local_34,(string *)((long)&prompt.field_2 + 8));
  uStack_250 = 0x1023c5;
  std::__cxx11::string::~string((string *)(prompt.field_2._M_local_buf + 8));
  lVar1 = -((ulong)local_34[0] * 4 + 0xf & 0xfffffffffffffff0);
  varToPopulate = (int *)((long)aiStack_248 + lVar1);
  for (lVar4 = 0; lVar4 < (int)local_34[0]; lVar4 = lVar4 + 1) {
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102418;
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"Please enter the value of element ",local_240);
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102420;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x10242b;
    poVar3 = std::operator<<((ostream *)local_240,local_c8);
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102436;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102445;
    std::operator<<(poVar3,": ");
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102454;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x10245f;
    getInt(varToPopulate,(string *)(prompt_1.field_2._M_local_buf + 8));
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102467;
    std::__cxx11::string::~string((string *)(prompt_1.field_2._M_local_buf + 8));
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x10246f;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
    *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x102477;
    std::__cxx11::string::~string(local_c8);
    varToPopulate = varToPopulate + 1;
  }
  *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x10248c;
  iVar2 = calculateEvenOddDifference((int *)((long)aiStack_248 + lVar1),local_34[0]);
  *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x1024a1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "The difference of the even numbers and odd numbers is: ");
  *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x1024ab;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  *(undefined8 *)((long)aiStack_248 + lVar1 + -8) = 0x1024b3;
  std::endl<char,std::char_traits<char>>(poVar3);
  uStack_250 = 0x1024c0;
  std::__cxx11::string::~string(local_88);
  return 0;
}

Assistant:

int main()
{
    int size;

    string prompt = "Please enter an array size: ";
    getInt(&size, prompt);

    int calcArray [size];
    for(int x = 0; x < size; x++)
    {
        //let's use a stream to combine a string and an int
        string prompt = "Please enter the value of element ";
        ostringstream promptStream;
        promptStream << prompt << x << ": ";

        // this function places the string value into our array
        getInt(&calcArray[x], promptStream.str());

    }

    //blah blah... long function name.... wheeeeeeeeee
    int difference = calculateEvenOddDifference(calcArray, size);

    cout << "The difference of the even numbers and odd numbers is: " << difference << endl;

    return 0;
}